

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O0

bool Grammar::is_spaces(string *str)

{
  long lVar1;
  string local_28 [16];
  string *in_stack_ffffffffffffffe8;
  
  str_utils::ltrim(in_stack_ffffffffffffffe8);
  lVar1 = std::__cxx11::string::size();
  std::__cxx11::string::~string(local_28);
  return lVar1 == 0;
}

Assistant:

bool Grammar::is_spaces(const std::string& str) {
    return str_utils::ltrim(str).size() == 0;
}